

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

void tap_suite_done(pcut_item_t *suite)

{
  pcut_item_t *suite_local;
  
  if (failed_tests_in_suite == 0) {
    printf("#> Finished suite %s (passed).\n",suite->name);
  }
  else {
    printf("#> Finished suite %s (failed %d of %d).\n",suite->name,
           (ulong)(uint)failed_tests_in_suite,(ulong)(uint)tests_in_suite);
  }
  return;
}

Assistant:

static void tap_suite_done(pcut_item_t *suite) {
	if (failed_tests_in_suite == 0) {
		printf("#> Finished suite %s (passed).\n",
				suite->name);
	} else {
		printf("#> Finished suite %s (failed %d of %d).\n",
				suite->name, failed_tests_in_suite, tests_in_suite);
	}
}